

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_add_rel_pos(ggml_compute_params *params,ggml_tensor *dst)

{
  long lVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  size_t __n;
  long lVar13;
  long lVar14;
  float *pfVar15;
  int64_t j;
  long lVar16;
  long lVar17;
  float *pfVar18;
  long lVar19;
  float *pfVar20;
  float *pfVar21;
  long local_78;
  float *local_70;
  long local_60;
  float *local_58;
  
  if (dst->src[0]->type == GGML_TYPE_F32) {
    pgVar5 = dst->src[1];
    pgVar6 = dst->src[2];
    if (dst->op_params[0] == 0) {
      if (params->ith == 0) {
        pvVar7 = dst->data;
        pvVar8 = dst->src[0]->data;
        __n = ggml_nbytes(dst);
        memcpy(pvVar7,pvVar8,__n);
      }
      ggml_barrier(params->threadpool);
    }
    iVar4 = (int)pgVar5->ne[3];
    iVar12 = (iVar4 + -1 + params->nth) / params->nth;
    local_78 = (long)params->ith * (long)iVar12;
    iVar12 = iVar12 + (int)local_78;
    if (iVar4 <= iVar12) {
      iVar12 = iVar4;
    }
    if ((int)local_78 < iVar12) {
      lVar9 = pgVar5->ne[0];
      lVar10 = pgVar5->ne[1];
      lVar11 = pgVar5->ne[2];
      pvVar7 = pgVar5->data;
      pvVar8 = pgVar6->data;
      lVar19 = lVar10 * lVar9 * lVar9;
      lVar14 = lVar19 * lVar11;
      local_70 = (float *)((long)dst->data + lVar14 * local_78 * 4);
      do {
        if (0 < lVar11) {
          local_60 = 0;
          local_58 = local_70;
          do {
            if (0 < lVar10) {
              lVar13 = 0;
              pfVar18 = local_58;
              do {
                if (0 < lVar9) {
                  lVar17 = 0;
                  pfVar20 = pfVar18;
                  pfVar21 = pfVar18;
                  do {
                    lVar1 = lVar17 + (lVar13 + (local_60 + local_78 * lVar11) * lVar10) * lVar9;
                    lVar16 = 0;
                    fVar2 = *(float *)((long)pvVar7 + lVar1 * 4);
                    fVar3 = *(float *)((long)pvVar8 + lVar1 * 4);
                    pfVar15 = pfVar20;
                    do {
                      pfVar21[lVar16] = fVar3 + pfVar21[lVar16];
                      lVar16 = lVar16 + 1;
                      *pfVar15 = fVar2 + *pfVar15;
                      pfVar15 = pfVar15 + lVar9;
                    } while (lVar9 != lVar16);
                    lVar17 = lVar17 + 1;
                    pfVar20 = pfVar20 + 1;
                    pfVar21 = pfVar21 + lVar9;
                  } while (lVar17 != lVar9);
                }
                lVar13 = lVar13 + 1;
                pfVar18 = pfVar18 + lVar9 * lVar9;
              } while (lVar13 != lVar10);
            }
            local_58 = local_58 + lVar19;
            local_60 = local_60 + 1;
          } while (local_60 != lVar11);
        }
        local_70 = local_70 + lVar14;
        local_78 = local_78 + 1;
      } while (local_78 != iVar12);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1eeb,"fatal error");
}

Assistant:

void ggml_compute_forward_add_rel_pos(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_add_rel_pos_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}